

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O0

int32 str2words(char *line,char **ptr,int32 max_ptr)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int local_28;
  int32 n;
  int32 i;
  int32 max_ptr_local;
  char **ptr_local;
  char *line_local;
  
  local_2c = 0;
  local_28 = 0;
  while( true ) {
    while( true ) {
      bVar2 = false;
      if (line[local_28] != '\0') {
        iVar1 = isspace_c(line[local_28]);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    if (line[local_28] == '\0') {
      return local_2c;
    }
    if ((ptr != (char **)0x0) && (max_ptr <= local_2c)) {
      for (; -1 < local_28; local_28 = local_28 + -1) {
        if (line[local_28] == '\0') {
          line[local_28] = ' ';
        }
      }
      return -1;
    }
    if (ptr != (char **)0x0) {
      ptr[local_2c] = line + local_28;
    }
    local_2c = local_2c + 1;
    while( true ) {
      bVar2 = false;
      if (line[local_28] != '\0') {
        iVar1 = isspace_c(line[local_28]);
        bVar2 = iVar1 == 0;
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    if (line[local_28] == '\0') break;
    if (ptr != (char **)0x0) {
      line[local_28] = '\0';
    }
    local_28 = local_28 + 1;
  }
  return local_2c;
}

Assistant:

int32
str2words(char *line, char **ptr, int32 max_ptr)
{
    int32 i, n;

    n = 0;                      /* #words found so far */
    i = 0;                      /* For scanning through the input string */
    while (1) {
        /* Skip whitespace before next word */
        while (line[i] && isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;

        if (ptr != NULL && n >= max_ptr) {
            /*
             * Pointer array size insufficient.  Restore NULL chars inserted so far
             * to space chars.  Not a perfect restoration, but better than nothing.
             */
            for (; i >= 0; --i)
                if (line[i] == '\0')
                    line[i] = ' ';

            return -1;
        }

        /* Scan to end of word */
        if (ptr != NULL)
            ptr[n] = line + i;
        ++n;
        while (line[i] && !isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;
        if (ptr != NULL)
            line[i] = '\0';
        ++i;
    }

    return n;
}